

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::GeneratedMessageReflection::SpaceUsedLong
          (GeneratedMessageReflection *this,Message *message)

{
  FieldDescriptor *this_00;
  uint uVar1;
  string *psVar2;
  bool bVar3;
  uint32 uVar4;
  Type TVar5;
  int iVar6;
  UnknownFieldSet *this_01;
  size_t sVar7;
  size_t sVar8;
  RepeatedField<float> *pRVar9;
  long *plVar10;
  Message **ppMVar11;
  undefined4 extraout_var;
  MapFieldBase *this_02;
  Rep *pRVar12;
  RepeatedField<bool> *pRVar13;
  RepeatedField<double> *pRVar14;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar15;
  RepeatedPtrFieldBase *pRVar16;
  Rep *pRVar17;
  long lVar18;
  ArenaStringPtr *pAVar19;
  Rep *pRVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  
  uVar1 = (this->schema_).object_size_;
  this_01 = GetUnknownFields(this,message);
  sVar7 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_01);
  sVar7 = sVar7 + uVar1;
  if ((this->schema_).extensions_offset_ != -1) {
    uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    sVar8 = ExtensionSet::SpaceUsedExcludingSelfLong
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4));
    sVar7 = sVar7 + sVar8;
  }
  if (-1 < this->last_non_weak_field_index_) {
    lVar23 = 0;
    do {
      this_00 = (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar23 * 0xa8);
      if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x4c + lVar23 * 0xa8) != 3) {
        lVar22 = *(long *)(this_00 + 0x60);
        if ((lVar22 == 0) ||
           (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                    (ulong)(uint)((int)((ulong)(lVar22 - *(long *)(*(long *)(lVar22 + 0x10) + 0x40))
                                       >> 4) * -0x55555554 + (this->schema_).oneof_case_offset_)) ==
            *(int *)(this_00 + 0x38))) {
          TVar5 = FieldDescriptor::type(this_00);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) == 10) {
            if ((this->schema_).default_instance_ != message) {
              ppMVar11 = GetRaw<google::protobuf::Message_const*>(this,message,this_00);
              if (*ppMVar11 != (Message *)0x0) {
                iVar6 = (*((*ppMVar11)->super_MessageLite)._vptr_MessageLite[0x14])();
                pRVar12 = (Rep *)CONCAT44(extraout_var,iVar6);
                goto LAB_003138ee;
              }
            }
          }
          else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) == 9) {
            if (this_00[0x50] == (FieldDescriptor)0x0) {
              plVar10 = (long *)(*(long *)(this_00 + 0x58) + 0x30);
            }
            else if (*(long *)(this_00 + 0x68) == 0) {
              plVar10 = (long *)(*(long *)(this_00 + 0x30) + 0x98);
            }
            else {
              plVar10 = (long *)(*(long *)(this_00 + 0x68) + 0x80);
            }
            psVar2 = *(string **)
                      ((long)&(((this->schema_).default_instance_)->super_MessageLite).
                              _vptr_MessageLite +
                      (ulong)(this->schema_).offsets_
                             [(int)((ulong)((long)this_00 - *plVar10) >> 3) * 0x3cf3cf3d]);
            pAVar19 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,this_00);
            if (pAVar19->ptr_ != psVar2) {
              sVar8 = StringSpaceUsedExcludingSelfLong(pAVar19->ptr_);
              sVar7 = sVar7 + sVar8 + 0x20;
            }
          }
        }
        goto switchD_0031376f_default;
      }
      TVar5 = FieldDescriptor::type(this_00);
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4)) {
      case 1:
      case 8:
        pRVar9 = (RepeatedField<float> *)
                 GetRaw<google::protobuf::RepeatedField<int>>(this,message,this_00);
        break;
      case 2:
        pRVar14 = (RepeatedField<double> *)
                  GetRaw<google::protobuf::RepeatedField<long>>(this,message,this_00);
        goto LAB_003138b4;
      case 3:
        pRVar9 = (RepeatedField<float> *)
                 GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,this_00);
        break;
      case 4:
        pRVar14 = (RepeatedField<double> *)
                  GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,this_00);
        goto LAB_003138b4;
      case 5:
        pRVar14 = GetRaw<google::protobuf::RepeatedField<double>>(this,message,this_00);
LAB_003138b4:
        pRVar20 = pRVar14->rep_;
        bVar3 = pRVar20 == (Rep *)0x0;
        pRVar12 = (Rep *)((long)pRVar14->total_size_ * 8 + 8);
        goto LAB_003138ea;
      case 6:
        pRVar9 = GetRaw<google::protobuf::RepeatedField<float>>(this,message,this_00);
        break;
      case 7:
        pRVar13 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,this_00);
        pRVar20 = (Rep *)pRVar13->rep_;
        pRVar12 = (Rep *)((long)pRVar13->total_size_ + 8);
        bVar3 = pRVar20 == (Rep *)0x0;
        goto LAB_003138ea;
      case 9:
        pRVar15 = GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            (this,message,this_00);
        lVar22 = (long)(pRVar15->super_RepeatedPtrFieldBase).total_size_ << 3;
        pRVar17 = (pRVar15->super_RepeatedPtrFieldBase).rep_;
        if (pRVar17 != (Rep *)0x0) {
          if (0 < pRVar17->allocated_size) {
            lVar21 = 0;
            do {
              sVar8 = StringSpaceUsedExcludingSelfLong((string *)pRVar17->elements[lVar21]);
              lVar22 = lVar22 + sVar8 + 0x20;
              lVar21 = lVar21 + 1;
              pRVar17 = (pRVar15->super_RepeatedPtrFieldBase).rep_;
            } while (lVar21 < pRVar17->allocated_size);
          }
LAB_00313987:
          lVar22 = lVar22 + 8;
        }
LAB_00313992:
        sVar7 = sVar7 + lVar22;
        goto switchD_0031376f_default;
      case 10:
        bVar3 = FieldDescriptor::is_map(this_00);
        if (!bVar3) {
          pRVar16 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,this_00);
          lVar22 = (long)pRVar16->total_size_ << 3;
          pRVar17 = pRVar16->rep_;
          if (pRVar17 != (Rep *)0x0) {
            if (0 < pRVar17->allocated_size) {
              lVar21 = 0;
              do {
                lVar18 = (**(code **)(*pRVar17->elements[lVar21] + 0xa0))();
                lVar22 = lVar22 + lVar18;
                lVar21 = lVar21 + 1;
                pRVar17 = pRVar16->rep_;
              } while (lVar21 < pRVar17->allocated_size);
            }
            goto LAB_00313987;
          }
          goto LAB_00313992;
        }
        this_02 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,this_00);
        pRVar12 = (Rep *)MapFieldBase::SpaceUsedExcludingSelfLong(this_02);
        goto LAB_003138ee;
      default:
        goto switchD_0031376f_default;
      }
      pRVar20 = (Rep *)pRVar9->rep_;
      bVar3 = pRVar20 == (Rep *)0x0;
      pRVar12 = (Rep *)((long)pRVar9->total_size_ * 4 + 8);
LAB_003138ea:
      if (bVar3) {
        pRVar12 = pRVar20;
      }
LAB_003138ee:
      sVar7 = (long)pRVar12->elements + (sVar7 - 8);
switchD_0031376f_default:
      bVar3 = lVar23 < this->last_non_weak_field_index_;
      lVar23 = lVar23 + 1;
    } while (bVar3);
  }
  return sVar7;
}

Assistant:

size_t GeneratedMessageReflection::SpaceUsedLong(const Message& message) const {
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field)     \
                          .SpaceUsedExcludingSelfLong();                      \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              total_size += GetRaw<RepeatedPtrField<string> >(message, field)
                                .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (field->containing_oneof() && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32 :
        case FieldDescriptor::CPPTYPE_INT64 :
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT :
        case FieldDescriptor::CPPTYPE_BOOL  :
        case FieldDescriptor::CPPTYPE_ENUM  :
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              // Initially, the string points to the default value stored in
              // the prototype. Only count the string if it has been changed
              // from the default value.
              const string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              const string* ptr =
                  &GetField<ArenaStringPtr>(message, field).Get();

              if (ptr != default_ptr) {
                // string fields are represented by just a pointer, so also
                // include sizeof(string) as well.
                total_size +=
                    sizeof(*ptr) + StringSpaceUsedExcludingSelfLong(*ptr);
              }
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != NULL) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  return total_size;
}